

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

QAnimationTimer * QAnimationTimer::instance(bool create)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  QAnimationTimer *this;
  
  lVar3 = __tls_get_addr(&PTR_006a9338);
  if (*(char *)(lVar3 + 0x80) == '\0') {
    instance();
  }
  plVar1 = (long *)(lVar3 + 0x78);
  if ((create) && (*(long *)(lVar3 + 0x78) == 0)) {
    this = (QAnimationTimer *)operator_new(0x78);
    QObject::QObject((QObject *)this,(QObject *)0x0);
    (this->super_QAbstractAnimationTimer).isRegistered = false;
    (this->super_QAbstractAnimationTimer).isPaused = false;
    (this->super_QAbstractAnimationTimer).pauseDuration = 0;
    (this->super_QAbstractAnimationTimer).super_QObject._vptr_QObject =
         (_func_int **)&PTR_metaObject_0069cfa8;
    (this->runningPauseAnimations).d.d = (Data *)0x0;
    (this->runningPauseAnimations).d.ptr = (QAbstractAnimation **)0x0;
    (this->runningPauseAnimations).d.size = 0;
    this->lastTick = 0;
    *(undefined8 *)((long)&this->lastTick + 7) = 0;
    (this->animations).d.d = (Data *)0x0;
    (this->animations).d.ptr = (QAbstractAnimation **)0x0;
    (this->animations).d.size = 0;
    (this->animationsToStart).d.d = (Data *)0x0;
    (this->animationsToStart).d.ptr = (QAbstractAnimation **)0x0;
    (this->animationsToStart).d.size = 0;
    this->runningLeafAnimations = 0;
    plVar2 = (long *)*plVar1;
    *plVar1 = (long)this;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))();
    }
  }
  else {
    this = (QAnimationTimer *)*plVar1;
  }
  return this;
}

Assistant:

QAnimationTimer *QAnimationTimer::instance(bool create)
{
    QAnimationTimer *inst;
#if QT_CONFIG(thread)
    static thread_local std::unique_ptr<QAnimationTimer> animationTimer;
    if (create && !animationTimer) {
        inst = new QAnimationTimer;
        animationTimer.reset(inst);
    } else {
        inst = animationTimer.get();
    }
#else
    Q_UNUSED(create);
    static QAnimationTimer animationTimer;
    inst = &animationTimer;
#endif
    return inst;
}